

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O3

bool __thiscall
wasm::StackIROptimizer::canRemoveSetGetPair(StackIROptimizer *this,Index setIndex,Index getIndex)

{
  Op OVar1;
  Expression *pEVar2;
  StackInst *pSVar3;
  Expression *pEVar4;
  bool bVar5;
  Type TVar6;
  StackIR *pSVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_register_00000014;
  pointer ppSVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  initializer_list<bool> __l;
  vector<bool,_std::allocator<bool>_> local_68;
  ulong local_40;
  bool local_32;
  allocator_type local_31;
  
  local_40 = CONCAT44(in_register_00000014,getIndex);
  if (getIndex <= setIndex) {
    __assert_fail("setIndex < getIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a0,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  pEVar2 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
           _M_impl.super__Vector_impl_data._M_start[setIndex]->origin;
  if (pEVar2->_id != LocalSetId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
  }
  TVar6 = Function::getLocalType(this->func,*(Index *)(pEVar2 + 1));
  if ((TVar6.id < 2) || ((TVar6.id & 1) != 0 && 6 < TVar6.id)) {
    __assert_fail("localType.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a7,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  bVar5 = Function::isParam(this->func,*(Index *)(pEVar2 + 1));
  bVar12 = 1;
  if ((!bVar5) && ((TVar6.id & 3) == 0 && 6 < TVar6.id)) {
    local_32 = false;
    __l._M_len = 1;
    __l._M_array = &local_32;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_68,__l,&local_31);
    uVar8 = (ulong)(setIndex + 1);
    pSVar7 = this->insts;
    ppSVar10 = (pSVar7->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    bVar12 = 1;
    if (uVar8 < (ulong)((long)(pSVar7->
                              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >> 3)) {
      uVar15 = setIndex + 2;
      local_40 = (ulong)(uint)-(int)local_40;
      iVar13 = 0;
      iVar14 = 0;
      do {
        pSVar3 = ppSVar10[uVar8];
        if (pSVar3 != (StackInst *)0x0) {
          OVar1 = pSVar3->op;
          if (OVar1 < (TryTableEnd|BlockBegin)) {
            if ((0x58a4U >> (OVar1 & 0x1f) & 1) == 0) {
              if ((0x214aU >> (OVar1 & 0x1f) & 1) == 0) {
                if ((0x610U >> (OVar1 & 0x1f) & 1) == 0) goto LAB_00cabe91;
                if (iVar13 == 0) goto LAB_00cabf47;
                uVar8 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        - 1;
                uVar9 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        + 0x3e;
                if (-1 < (long)uVar8) {
                  uVar9 = uVar8;
                }
                uVar11 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001);
                iVar14 = iVar14 - (uint)((local_68.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p
                                          [((long)uVar9 >> 6) + (uVar11 - 1)] >> (uVar8 & 0x3f) & 1)
                                        != 0);
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar11 - 1)] =
                     local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                     [((long)uVar9 >> 6) + (uVar11 - 1)] & ~(1L << (uVar8 & 0x3f));
              }
              else {
                std::vector<bool,_std::allocator<bool>_>::push_back(&local_68,false);
                iVar13 = iVar13 + 1;
                pSVar7 = this->insts;
                ppSVar10 = (pSVar7->
                           super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
              }
            }
            else {
              if (iVar13 == 0) {
LAB_00cabf47:
                pSVar7 = (StackIR *)0x1;
                bVar12 = 0;
                goto LAB_00cabf4c;
              }
              iVar13 = iVar13 + -1;
              uVar8 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                      1;
              uVar9 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      0x3e;
              if (-1 < (long)uVar8) {
                uVar9 = uVar8;
              }
              iVar14 = iVar14 - (uint)((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                        _M_p[((long)uVar9 >> 6) +
                                             ((ulong)((uVar8 & 0x800000000000003f) <
                                                     0x8000000000000001) - 1)] >> (uVar8 & 0x3f) & 1
                                       ) != 0);
              bVar5 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
              local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset =
                   local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
              if (bVar5) {
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p =
                     local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
              }
            }
          }
          else {
LAB_00cabe91:
            pEVar4 = pSVar3->origin;
            if (pEVar4->_id == LocalGetId) {
              if (((*(int *)(pEVar4 + 1) == *(int *)(pEVar2 + 1)) && ((int)local_40 + uVar15 != 1))
                 && (iVar14 == 0)) {
                bVar12 = 0;
                pSVar7 = (StackIR *)0x0;
                goto LAB_00cabf4c;
              }
            }
            else if ((pEVar4->_id == LocalSetId) && (*(int *)(pEVar4 + 1) == *(int *)(pEVar2 + 1)))
            {
              uVar8 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                      1;
              uVar9 = (ulong)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      0x3e;
              if (-1 < (long)uVar8) {
                uVar9 = uVar8;
              }
              uVar11 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001);
              if ((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                   [((long)uVar9 >> 6) + (uVar11 - 1)] >> (uVar8 & 0x3f) & 1) == 0) {
                if (iVar13 == 0) goto LAB_00cabf47;
                iVar14 = iVar14 + 1;
                local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar11 - 1)] =
                     1L << ((byte)uVar8 & 0x3f) |
                     local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                     [((long)uVar9 >> 6) + (uVar11 - 1)];
              }
            }
          }
        }
        uVar8 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar8 < (ulong)((long)(pSVar7->
                                     super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10 >>
                              3));
      bVar12 = 1;
LAB_00cabf4c:
      bVar12 = bVar12 | (byte)pSVar7;
    }
    if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool StackIROptimizer::canRemoveSetGetPair(Index setIndex, Index getIndex) {
  // The set must be before the get.
  assert(setIndex < getIndex);

  auto* set = insts[setIndex]->origin->cast<LocalSet>();
  auto localType = func->getLocalType(set->index);
  // Note we do not need to handle tuples here, as the parent ignores them
  // anyhow (hence we can check non-nullability instead of non-
  // defaultability).
  assert(localType.isSingle());
  if (func->isParam(set->index) || !localType.isNonNullable()) {
    // This local cannot pose a problem for validation (params are always
    // initialized, and it is ok if nullable locals are uninitialized).
    return true;
  }

  // Track the depth (in block/if/loop/etc. scopes) relative to our starting
  // point. Anything less deep than that is not interesting, as we can only
  // help things at our depth or deeper to validate.
  Index currDepth = 0;

  // Look for a different get than the one in getIndex (since that one is
  // being removed) which would stop validating without the set. While doing
  // so, note other sets that ensure validation even if our set is removed. We
  // track those in this stack of booleans, one for each scope, which is true
  // if another sets covers us and ours is not needed.
  //
  // We begin in the current scope and with no other set covering us.
  std::vector<bool> coverStack = {false};

  // Track the total number of covers as well, for quick checking below.
  Index covers = 0;

  // TODO: We could look before us as well, but then we might end up scanning
  //       much of the function every time.
  for (Index i = setIndex + 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (isControlFlowBegin(inst)) {
      // A new scope begins.
      currDepth++;
      coverStack.push_back(false);
    } else if (isControlFlowEnd(inst)) {
      if (currDepth == 0) {
        // Less deep than the start, so we found no problem.
        return true;
      }
      currDepth--;

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.pop_back();
    } else if (isControlFlowBarrier(inst)) {
      // A barrier, like the else in an if-else, not only ends a scope but
      // opens a new one.
      if (currDepth == 0) {
        // Another scope with the same depth begins, but ours ended, so stop.
        return true;
      }

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.back() = false;
    } else if (auto* otherSet = inst->origin->dynCast<LocalSet>()) {
      // We are covered in this scope henceforth.
      if (otherSet->index == set->index) {
        if (!coverStack.back()) {
          covers++;
          if (currDepth == 0) {
            // We have a cover at depth 0, so everything from here on out
            // will be covered.
            return true;
          }
          coverStack.back() = true;
        }
      }
    } else if (auto* otherGet = inst->origin->dynCast<LocalGet>()) {
      if (otherGet->index == set->index && i != getIndex && !covers) {
        // We found a get that might be a problem: it uses the same index, but
        // is not the get we were told about, and no other set covers us.
        return false;
      }
    }
  }

  // No problem.
  return true;
}